

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_token.cpp
# Opt level: O0

void __thiscall CNetTokenManager::GenerateSeed(CNetTokenManager *this)

{
  TOKEN TVar1;
  int64 iVar2;
  int64 iVar3;
  CNetTokenManager *in_RDI;
  NETADDR *in_stack_ffffffffffffffe8;
  
  in_RDI->m_PrevSeed = in_RDI->m_Seed;
  secure_random_fill(in_RDI,(uint)((ulong)in_stack_ffffffffffffffe8 >> 0x20));
  in_RDI->m_PrevGlobalToken = in_RDI->m_GlobalToken;
  TVar1 = GenerateToken(in_RDI,in_stack_ffffffffffffffe8);
  in_RDI->m_GlobalToken = TVar1;
  iVar2 = time_get();
  iVar3 = time_freq();
  in_RDI->m_NextSeedTime = iVar2 + iVar3 * in_RDI->m_SeedTime;
  return;
}

Assistant:

void CNetTokenManager::GenerateSeed()
{
	static const NETADDR NullAddr = { 0 };
	m_PrevSeed = m_Seed;

	secure_random_fill(&m_Seed, sizeof(m_Seed));

	m_PrevGlobalToken = m_GlobalToken;
	m_GlobalToken = GenerateToken(&NullAddr);

	m_NextSeedTime = time_get() + time_freq() * m_SeedTime;
}